

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O1

ChebyshevExpansion * __thiscall
ChebTools::ChebyshevExpansion::times_x_inplace(ChebyshevExpansion *this)

{
  long lVar1;
  long lVar2;
  double *pdVar3;
  bool bVar4;
  Index new_rows;
  long lVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  lVar1 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  dVar9 = this->m_xmax;
  dVar11 = this->m_xmin;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize
            ((DenseStorage<double,__1,__1,_1,_0> *)this,lVar1 + 1,lVar1 + 1,1);
  if ((-1 < lVar1) &&
     (lVar2 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows, lVar1 < lVar2)) {
    dVar8 = (dVar9 - dVar11) * 0.5;
    dVar11 = (dVar9 + dVar11) * 0.5;
    pdVar3 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    pdVar3[lVar1] = 0.0;
    dVar9 = 0.0;
    if (2 < lVar1) {
      if ((lVar2 < 1) || (lVar2 == 1)) goto LAB_0012fcb5;
      dVar9 = *pdVar3;
      *pdVar3 = pdVar3[1] * 0.5 * dVar8 + dVar11 * dVar9;
    }
    if (3 < lVar1) {
      if ((lVar2 < 2) || (lVar2 == 2)) goto LAB_0012fcb5;
      dVar10 = pdVar3[2] * 0.5 + dVar9;
      dVar9 = pdVar3[1];
      pdVar3[1] = dVar10 * dVar8 + dVar11 * dVar9;
    }
    if (3 < lVar1) {
      lVar5 = 2;
      if (2 < lVar2) {
        lVar5 = lVar2;
      }
      lVar6 = 3;
      if (3 < lVar2) {
        lVar6 = lVar2;
      }
      lVar7 = 0;
      dVar10 = dVar9;
      do {
        if ((lVar5 + -2 == lVar7) || (lVar6 + -3 == lVar7)) goto LAB_0012fcb5;
        dVar9 = pdVar3[lVar7 + 2];
        pdVar3[lVar7 + 2] = (dVar10 + pdVar3[lVar7 + 3]) * 0.5 * dVar8 + dVar11 * dVar9;
        lVar7 = lVar7 + 1;
        dVar10 = dVar9;
      } while (lVar1 + -3 != lVar7);
    }
    lVar5 = lVar1 + -1;
    while ((-1 < lVar1 + -1 && (lVar5 < lVar2))) {
      dVar10 = pdVar3[lVar5];
      pdVar3[lVar5] = dVar9 * 0.5 * dVar8 + dVar11 * dVar10;
      bVar4 = lVar1 <= lVar5;
      lVar5 = lVar5 + 1;
      dVar9 = dVar10;
      if (bVar4) {
        return this;
      }
    }
  }
LAB_0012fcb5:
  __assert_fail("index >= 0 && index < size()",
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                ,0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

ChebyshevExpansion& ChebyshevExpansion::times_x_inplace() {
        Eigen::Index N = m_c.size() - 1; // N is the order of A
        double diff = ((m_xmax - m_xmin) / 2.0), plus = (m_xmax + m_xmin) / 2.0;
        double cim1old = 0, ciold = 0;
        m_c.conservativeResize(N+2);
        m_c(N+1) = 0.0; // Fill the last entry with a zero
        if (N > 1) {
            // 0-th element
            cim1old = m_c(0); // store the current 0-th element in temporary variable
            m_c(0) = diff*(0.5*m_c(1)) + plus*m_c(0);
        }
        if (N > 2) {
            // 1-th element
            ciold = m_c(1); // store the current 1-th element in temporary variable
            m_c(1) = diff*(cim1old + 0.5*m_c(2)) + plus*m_c(1);
            cim1old = ciold;
        }
        for (Eigen::Index i = 2; i <= N-1; ++i) {
            ciold = m_c(i); // store the current i-th element in temporary variable
            m_c(i) = diff*(0.5*(cim1old + m_c(i + 1)))+plus*m_c(i);
            cim1old = ciold;
        }
        for (Eigen::Index i = N; i <= N + 1; ++i) {
            ciold = m_c(i); // store the current i-th element in temporary variable
            m_c(i) = diff*(0.5*cim1old) + plus*m_c(i);
            cim1old = ciold;
        }
        return *this;
    }